

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathFreeObject(xmlXPathObjectPtr obj)

{
  xmlXPathObjectPtr obj_local;
  
  if (obj != (xmlXPathObjectPtr)0x0) {
    if ((obj->type == XPATH_NODESET) || (obj->type == XPATH_XSLT_TREE)) {
      if (obj->boolval == 0) {
        if (obj->nodesetval != (xmlNodeSetPtr)0x0) {
          xmlXPathFreeNodeSet(obj->nodesetval);
        }
      }
      else {
        obj->type = XPATH_XSLT_TREE;
        if (obj->nodesetval != (xmlNodeSetPtr)0x0) {
          xmlXPathFreeValueTree(obj->nodesetval);
        }
      }
    }
    else if (obj->type == XPATH_LOCATIONSET) {
      if (obj->user != (void *)0x0) {
        xmlXPtrFreeLocationSet((xmlLocationSetPtr)obj->user);
      }
    }
    else if ((obj->type == XPATH_STRING) && (obj->stringval != (xmlChar *)0x0)) {
      (*xmlFree)(obj->stringval);
    }
    (*xmlFree)(obj);
  }
  return;
}

Assistant:

void
xmlXPathFreeObject(xmlXPathObjectPtr obj) {
    if (obj == NULL) return;
    if ((obj->type == XPATH_NODESET) || (obj->type == XPATH_XSLT_TREE)) {
	if (obj->boolval) {
#if 0
	    if (obj->user != NULL) {
                xmlXPathFreeNodeSet(obj->nodesetval);
		xmlFreeNodeList((xmlNodePtr) obj->user);
	    } else
#endif
	    obj->type = XPATH_XSLT_TREE; /* TODO: Just for debugging. */
	    if (obj->nodesetval != NULL)
		xmlXPathFreeValueTree(obj->nodesetval);
	} else {
	    if (obj->nodesetval != NULL)
		xmlXPathFreeNodeSet(obj->nodesetval);
	}
#ifdef LIBXML_XPTR_ENABLED
    } else if (obj->type == XPATH_LOCATIONSET) {
	if (obj->user != NULL)
	    xmlXPtrFreeLocationSet(obj->user);
#endif
    } else if (obj->type == XPATH_STRING) {
	if (obj->stringval != NULL)
	    xmlFree(obj->stringval);
    }
#ifdef XP_DEBUG_OBJ_USAGE
    xmlXPathDebugObjUsageReleased(NULL, obj->type);
#endif
    xmlFree(obj);
}